

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O2

void __thiscall Barrier::waitForFinish(Barrier *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->barrierMutex);
  while ((this->activitiesNumber).super___atomic_base<int>._M_i != 0) {
    std::condition_variable::wait((unique_lock *)&this->barrierCV);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void Barrier::waitForFinish () {
	std::unique_lock<std::mutex> lock (barrierMutex);
	barrierCV.wait (lock, [&] {return activitiesNumber == 0;});
}